

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O2

Error * ot::commissioner::internal::DecodeChildIpv6AddressList
                  (Error *__return_storage_ptr__,
                  vector<ot::commissioner::ChildIpv6AddrInfo,_std::allocator<ot::commissioner::ChildIpv6AddrInfo>_>
                  *aChildIpv6AddressInfoList,ByteArray *aBuf)

{
  char cVar1;
  ErrorCode EVar2;
  ushort *puVar3;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __last;
  ushort uVar4;
  ushort uVar5;
  Error *pEVar6;
  char *from;
  char *to;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  writer write;
  string local_d0;
  undefined1 local_b0 [40];
  ChildIpv6AddrInfo childIpv6AddrsInfo;
  undefined1 local_68 [8];
  char *local_60;
  size_type local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  parse_func local_40 [1];
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  puVar3 = (ushort *)
           (aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  __last._M_current =
       (aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  childIpv6AddrsInfo.mRloc16 = 0;
  childIpv6AddrsInfo.mChildId = 0;
  childIpv6AddrsInfo.mAddrs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  childIpv6AddrsInfo.mAddrs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  childIpv6AddrsInfo.mAddrs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (((int)__last._M_current - (int)puVar3 & 0xfU) == 2) {
    uVar4 = *puVar3 << 8;
    uVar5 = *puVar3 >> 8;
    childIpv6AddrsInfo.mChildId = uVar4 & 0x1ff | uVar5;
    childIpv6AddrsInfo.mRloc16 = uVar4 | uVar5;
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    vector<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_b0,
               (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )(puVar3 + 1),__last,(allocator_type *)&local_d0);
    DecodeIpv6AddressList((Error *)local_68,&childIpv6AddrsInfo.mAddrs,(ByteArray *)local_b0);
    pEVar6 = Error::operator=(__return_storage_ptr__,(Error *)local_68);
    EVar2 = pEVar6->mCode;
    std::__cxx11::string::~string((string *)&local_60);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_b0);
    if (EVar2 == kNone) {
      std::
      vector<ot::commissioner::ChildIpv6AddrInfo,std::allocator<ot::commissioner::ChildIpv6AddrInfo>>
      ::emplace_back<ot::commissioner::ChildIpv6AddrInfo&>
                ((vector<ot::commissioner::ChildIpv6AddrInfo,std::allocator<ot::commissioner::ChildIpv6AddrInfo>>
                  *)aChildIpv6AddressInfoList,&childIpv6AddrsInfo);
    }
  }
  else {
    local_68._0_4_ = none_type;
    local_60 = "premature end of Child IPv6 Address";
    local_58 = 0x23;
    local_50._M_allocated_capacity = 0;
    local_40[0] = (parse_func)0x0;
    from = "premature end of Child IPv6 Address";
    write.handler_ = (format_string_checker<char> *)local_68;
    local_50._8_8_ = (format_string_checker<char> *)local_68;
    while (from != "") {
      cVar1 = *from;
      to = from;
      while (cVar1 != '{') {
        to = to + 1;
        if (to == "") {
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()(&write,from,"");
          goto LAB_00158e61;
        }
        cVar1 = *to;
      }
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
      operator()(&write,from,to);
      from = ::fmt::v10::detail::
             parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                       (to,"",(format_string_checker<char> *)local_68);
    }
LAB_00158e61:
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_68;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_d0,(v10 *)"premature end of Child IPv6 Address",(string_view)ZEXT816(0x23),
               args);
    local_b0._0_4_ = kBadFormat;
    std::__cxx11::string::string((string *)(local_b0 + 8),(string *)&local_d0);
    Error::operator=(__return_storage_ptr__,(Error *)local_b0);
    std::__cxx11::string::~string((string *)(local_b0 + 8));
    std::__cxx11::string::~string((string *)&local_d0);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&childIpv6AddrsInfo.mAddrs);
  return __return_storage_ptr__;
}

Assistant:

Error internal::DecodeChildIpv6AddressList(std::vector<ChildIpv6AddrInfo> &aChildIpv6AddressInfoList,
                                           const ByteArray                &aBuf)
{
    Error             error;
    size_t            length = aBuf.size();
    ChildIpv6AddrInfo childIpv6AddrsInfo;

    VerifyOrExit((length % kIpv6AddressBytes) == kRloc16Bytes,
                 error = ERROR_BAD_FORMAT("premature end of Child IPv6 Address"));
    childIpv6AddrsInfo.mRloc16  = utils::Decode<uint16_t>(aBuf.data(), kRloc16Bytes);
    childIpv6AddrsInfo.mChildId = childIpv6AddrsInfo.mRloc16 & 0x1FF;

    SuccessOrExit(error = DecodeIpv6AddressList(childIpv6AddrsInfo.mAddrs, {aBuf.begin() + kRloc16Bytes, aBuf.end()}));
    aChildIpv6AddressInfoList.emplace_back(childIpv6AddrsInfo);

exit:
    return error;
}